

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ConversionError::~ConversionError(ConversionError *this)

{
  void *in_RDI;
  
  ~ConversionError((ConversionError *)0x1b6eb8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

ConversionError(std::string member, std::string name)
        : ConversionError("The value " + member + " is not an allowed value for " + name) {}